

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O3

REF_STATUS ref_matrix_bound(REF_DBL *m1,REF_DBL *m2,REF_DBL *m12)

{
  REF_INT i;
  uint uVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  REF_DBL m2bar [6];
  REF_DBL m1neghalf [6];
  REF_DBL m1half [6];
  REF_DBL m12bar [6];
  undefined1 local_148 [16];
  double local_138;
  REF_DBL local_e8 [6];
  REF_DBL local_b8 [6];
  REF_DBL local_88 [6];
  REF_DBL local_58 [6];
  
  uVar1 = ref_matrix_diag_m(m1,(REF_DBL *)local_148);
  dVar4 = (double)local_148._8_8_;
  if (uVar1 == 0) {
    if ((((double)local_148._0_8_ < 0.0) || ((double)local_148._8_8_ < 0.0)) || (local_138 < 0.0)) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c",
             0x240,"ref_matrix_sqrt_abs_m","ABS(eigenvalues)");
      printf("eigs %24.15e %24.15e %24.15e\n");
      ref_matrix_show_m(m1);
    }
    if ((double)local_148._0_8_ <= -(double)local_148._0_8_) {
      local_148._0_8_ = -(double)local_148._0_8_;
    }
    if (dVar4 <= -dVar4) {
      dVar4 = -dVar4;
    }
    if ((double)local_148._0_8_ < 0.0) {
      dVar3 = sqrt((double)local_148._0_8_);
    }
    else {
      dVar3 = SQRT((double)local_148._0_8_);
    }
    dVar5 = local_138;
    if (local_138 <= -local_138) {
      dVar5 = -local_138;
    }
    local_148._0_8_ = dVar3;
    if (dVar4 < 0.0) {
      dVar4 = sqrt(dVar4);
    }
    else {
      dVar4 = SQRT(dVar4);
    }
    local_148._8_8_ = dVar4;
    if (dVar5 < 0.0) {
      dVar5 = sqrt(dVar5);
    }
    else {
      dVar5 = SQRT(dVar5);
    }
    local_138 = dVar5;
    ref_matrix_form_m((REF_DBL *)local_148,local_88);
    dVar6 = dVar3 * 1e+20;
    if (dVar6 <= -dVar6) {
      dVar6 = -dVar6;
    }
    if (1.0 < dVar6) {
      dVar6 = dVar4 * 1e+20;
      if (dVar6 <= -dVar6) {
        dVar6 = -dVar6;
      }
      if (1.0 < dVar6) {
        local_148._8_8_ = 1.0 / dVar4;
        local_148._0_8_ = 1.0 / dVar3;
        dVar4 = dVar5 * 1e+20;
        if (dVar4 <= -dVar4) {
          dVar4 = -dVar4;
        }
        if (1.0 < dVar4) {
          local_138 = 1.0 / dVar5;
          ref_matrix_form_m((REF_DBL *)local_148,local_b8);
          ref_matrix_mult_m0m1m0(local_b8,m2,local_e8);
          uVar1 = ref_matrix_diag_m(local_e8,(REF_DBL *)local_148);
          if (uVar1 == 0) {
            local_148 = minpd(_DAT_0020f890,local_148);
            dVar4 = 1.0;
            if (local_138 <= 1.0) {
              dVar4 = local_138;
            }
            local_138 = dVar4;
            ref_matrix_form_m((REF_DBL *)local_148,local_58);
            ref_matrix_mult_m0m1m0(local_88,local_58,m12);
            return 0;
          }
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c",
                 0x2f1,"ref_matrix_bound",(ulong)uVar1,"diag m12bar");
          puts("m1");
          ref_matrix_show_m(m1);
          puts("m2");
          ref_matrix_show_m(m2);
          puts("m2bar");
          ref_matrix_show_m(local_e8);
          puts("m1neghalf");
          m2 = local_b8;
          goto LAB_001b2639;
        }
      }
    }
    uVar1 = 0;
    lVar2 = 0;
    do {
      m12[lVar2] = m2[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 6);
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c",0x23d,
           "ref_matrix_sqrt_abs_m",(ulong)uVar1,"diag");
    ref_matrix_show_m(m1);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c",0x2e0,
           "ref_matrix_bound","ref_matrix_sqrt_m failed");
    puts("m1");
    ref_matrix_show_m(m1);
    puts("m2");
LAB_001b2639:
    ref_matrix_show_m(m2);
  }
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_bound(REF_DBL *m1, REF_DBL *m2, REF_DBL *m12) {
  REF_DBL m1half[6];
  REF_DBL m1neghalf[6];
  REF_DBL m2bar[6];
  REF_DBL m12bar[6];
  REF_DBL m12bar_system[12];
  REF_STATUS sqrt_m1_status;
  sqrt_m1_status = ref_matrix_sqrt_abs_m(m1, m1half, m1neghalf);
  if (REF_DIV_ZERO == sqrt_m1_status) {
    REF_INT i;
    for (i = 0; i < 6; i++) m12[i] = m2[i];
    return REF_SUCCESS;
  }
  if (REF_SUCCESS != sqrt_m1_status) {
    REF_WHERE("ref_matrix_sqrt_m failed");
    printf("m1\n");
    ref_matrix_show_m(m1);
    printf("m2\n");
    ref_matrix_show_m(m2);
    return sqrt_m1_status;
  }
  RSS(ref_matrix_mult_m0m1m0(m1neghalf, m2, m2bar), "m2bar=m1half*m2*m1half");
  RSB(ref_matrix_diag_m(m2bar, m12bar_system), "diag m12bar", {
    printf("m1\n");
    ref_matrix_show_m(m1);
    printf("m2\n");
    ref_matrix_show_m(m2);
    printf("m2bar\n");
    ref_matrix_show_m(m2bar);
    printf("m1neghalf\n");
    ref_matrix_show_m(m1neghalf);
  });
  ref_matrix_eig(m12bar_system, 0) = MIN(1.0, ref_matrix_eig(m12bar_system, 0));
  ref_matrix_eig(m12bar_system, 1) = MIN(1.0, ref_matrix_eig(m12bar_system, 1));
  ref_matrix_eig(m12bar_system, 2) = MIN(1.0, ref_matrix_eig(m12bar_system, 2));

  RSS(ref_matrix_form_m(m12bar_system, m12bar), "form m12bar");

  RSS(ref_matrix_mult_m0m1m0(m1half, m12bar, m12), "m12=m1half*m12bar*m1half");

  return REF_SUCCESS;
}